

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPathShape.cpp
# Opt level: O2

void __thiscall chrono::ChPathShape::ArchiveOUT(ChPathShape *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::geometry::ChLinePath>_> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChPathShape>(marchive);
  ChVisualShape::ArchiveOUT(&this->super_ChVisualShape,marchive);
  local_28._value = &this->gpath;
  local_28._name = "gpath";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChPathShape::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChPathShape>();
    // serialize parent class
    ChVisualShape::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(gpath);
}